

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autodumper.cpp
# Opt level: O2

void autoDump(string *pathIn,string *baseNamePathOut,CRC32Lookup *crc,bool recursive,bool autoConv)

{
  CRC32Lookup crc_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  ZounaClasses type;
  DIR *__dirp;
  dirent *pdVar4;
  Parser *pPVar5;
  long *plVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  runtime_error *prVar7;
  string *psVar8;
  undefined8 in_stack_fffffffffffffa18;
  undefined8 in_stack_fffffffffffffa38;
  undefined1 recursive_00;
  uint uVar9;
  undefined4 in_stack_fffffffffffffa44;
  string totalPath;
  string newbase;
  string fileExt;
  string local_550;
  string local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  string local_4f0;
  string local_4d0 [32];
  string local_4b0;
  string local_490;
  string local_470 [32];
  string local_450;
  string local_430 [32];
  string local_410;
  string local_3f0;
  string local_3d0 [32];
  string local_3b0;
  string local_390;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
  local_1b0;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
  local_180;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
  local_150;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
  local_120;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
  local_f0;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
  local_c0;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
  local_90;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
  local_60;
  undefined4 extraout_var;
  
  std::__cxx11::string::string((string *)&local_1d0,(string *)pathIn);
  bVar1 = isADirectory(&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  uVar9 = (uint)recursive;
  if (bVar1) {
    __dirp = opendir((pathIn->_M_dataplus)._M_p);
    uVar2 = (uint)autoConv;
    do {
      pdVar4 = readdir(__dirp);
      if (pdVar4 == (dirent *)0x0) {
        closedir(__dirp);
        return;
      }
      std::__cxx11::string::string((string *)&fileExt,pdVar4->d_name,(allocator *)&totalPath);
      bVar1 = std::operator==(&fileExt,".");
      if ((!bVar1) && (bVar1 = std::operator==(&fileExt,".."), !bVar1)) {
        std::__cxx11::string::string((string *)&local_1f0,(string *)pathIn);
        trailFolder(&newbase,&local_1f0);
        std::operator+(&totalPath,&newbase,&fileExt);
        std::__cxx11::string::~string((string *)&newbase);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::string((string *)&local_210,(string *)&totalPath);
        bVar1 = isADirectory(&local_210);
        std::__cxx11::string::~string((string *)&local_210);
        if (bVar1 && recursive) {
          std::__cxx11::string::string((string *)&local_230,(string *)baseNamePathOut);
          bVar1 = isADirectory(&local_230);
          std::__cxx11::string::~string((string *)&local_230);
          if (!bVar1) {
            mkdir((baseNamePathOut->_M_dataplus)._M_p,0x1c0);
          }
          std::__cxx11::string::string((string *)&local_250,(string *)baseNamePathOut);
          trailFolder(&local_550,&local_250);
          std::operator+(&newbase,&local_550,&fileExt);
          std::__cxx11::string::~string((string *)&local_550);
          std::__cxx11::string::~string((string *)&local_250);
          std::__cxx11::string::string((string *)&local_270,(string *)&newbase);
          bVar1 = isADirectory(&local_270);
          std::__cxx11::string::~string((string *)&local_270);
          if ((!bVar1) && (iVar3 = mkdir(newbase._M_dataplus._M_p,0x1c0), iVar3 != 0)) {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string
                      ((string *)&local_290,"Couldn\'t open %s for writing!\n",
                       (allocator *)&stack0xfffffffffffffa3f);
            formatString<char_const*>(&local_550,&local_290,newbase._M_dataplus._M_p);
            std::runtime_error::runtime_error(prVar7,(string *)&local_550);
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::__cxx11::string::string((string *)&local_390,(string *)&totalPath);
          trailFolder(&local_2b0,&local_390);
          std::__cxx11::string::string((string *)&local_2f0,(string *)&newbase);
          trailFolder(&local_2d0,&local_2f0);
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
          ::_Rb_tree(&local_60,
                     (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
                      *)crc);
          autoDump(&local_2b0,&local_2d0,(CRC32Lookup *)&local_60,true,SUB41(uVar2,0));
          CRC32Lookup::~CRC32Lookup((CRC32Lookup *)&local_60);
          std::__cxx11::string::~string((string *)&local_2d0);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::__cxx11::string::~string((string *)&local_2b0);
          std::__cxx11::string::~string((string *)&local_390);
          psVar8 = &newbase;
        }
        else {
          std::__cxx11::string::string((string *)&local_310,(string *)&totalPath);
          std::operator+(&local_350,baseNamePathOut,&fileExt);
          getFileBase(&local_330,&local_350);
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
          ::_Rb_tree(&local_90,
                     (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
                      *)crc);
          psVar8 = &local_310;
          autoDump(psVar8,&local_330,(CRC32Lookup *)&local_90,SUB41(uVar9,0),SUB41(uVar2,0));
          CRC32Lookup::~CRC32Lookup((CRC32Lookup *)&local_90);
          std::__cxx11::string::~string((string *)&local_330);
          std::__cxx11::string::~string((string *)&local_350);
        }
        std::__cxx11::string::~string((string *)psVar8);
        std::__cxx11::string::~string((string *)&totalPath);
      }
      std::__cxx11::string::~string((string *)&fileExt);
    } while( true );
  }
  std::__cxx11::string::string((string *)&local_3b0,(string *)pathIn);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
  ::_Rb_tree(&local_f0,
             (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
              *)crc);
  type = autoDetectFile(&local_3b0,(CRC32Lookup *)&local_f0);
  CRC32Lookup::~CRC32Lookup((CRC32Lookup *)&local_f0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
  ::_Rb_tree(&local_c0,
             (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
              *)crc);
  crc_00.m_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = baseNamePathOut;
  crc_00.m_map._M_t._M_impl._0_8_ = in_stack_fffffffffffffa18;
  crc_00.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)crc;
  crc_00.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pathIn;
  crc_00.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffffa38;
  crc_00.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = uVar9;
  crc_00.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = in_stack_fffffffffffffa44;
  pPVar5 = getMatchingParser(type,crc_00);
  recursive_00 = (undefined1)uVar9;
  CRC32Lookup::~CRC32Lookup((CRC32Lookup *)&local_c0);
  fileExt._M_dataplus._M_p = (pointer)&fileExt.field_2;
  fileExt._M_string_length = 0;
  fileExt.field_2._M_local_buf[0] = '\0';
  if (type == DPC) {
    std::__cxx11::string::string(local_430,(string *)pathIn);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
    ::_Rb_tree(&local_150,
               (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
                *)crc);
    iVar3 = (*pPVar5->_vptr_Parser[2])(pPVar5,local_430,&local_150);
    plVar6 = (long *)CONCAT44(extraout_var_01,iVar3);
    CRC32Lookup::~CRC32Lookup((CRC32Lookup *)&local_150);
    std::__cxx11::string::~string(local_430);
    std::__cxx11::string::string((string *)&local_450,(string *)baseNamePathOut);
    trailFolder(&totalPath,&local_450);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::string(local_470,(string *)&totalPath);
    (**(code **)(*plVar6 + 0x18))(plVar6,local_470);
    std::__cxx11::string::~string(local_470);
    if (autoConv) {
      std::__cxx11::string::string((string *)&local_490,(string *)&totalPath);
      std::__cxx11::string::string((string *)&local_4b0,(string *)&totalPath);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
      ::_Rb_tree(&local_180,
                 (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
                  *)crc);
      autoDump(&local_490,&local_4b0,(CRC32Lookup *)&local_180,(bool)recursive_00,true);
      CRC32Lookup::~CRC32Lookup((CRC32Lookup *)&local_180);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_490);
    }
    (*pPVar5->_vptr_Parser[1])(pPVar5);
    (**(code **)(*plVar6 + 0x10))(plVar6);
    std::__cxx11::string::~string((string *)&totalPath);
  }
  else {
    if (type == sdx) {
      std::__cxx11::string::string(local_3d0,(string *)pathIn);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
      ::_Rb_tree(&local_120,
                 (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
                  *)crc);
      iVar3 = (*pPVar5->_vptr_Parser[2])(pPVar5,local_3d0,&local_120);
      plVar6 = (long *)CONCAT44(extraout_var,iVar3);
      CRC32Lookup::~CRC32Lookup((CRC32Lookup *)&local_120);
      std::__cxx11::string::~string(local_3d0);
      std::__cxx11::string::string((string *)&local_410,(string *)baseNamePathOut);
      trailFolder(&local_3f0,&local_410);
      (**(code **)(*plVar6 + 0x18))(plVar6,&local_3f0);
      std::__cxx11::string::~string((string *)&local_3f0);
      psVar8 = &local_410;
    }
    else {
      if (((type != Bitmap_Z) && (type != Mesh_Z)) && (type != Sound_Z)) goto LAB_0010612b;
      std::__cxx11::string::assign((char *)&fileExt);
      std::__cxx11::string::string(local_4d0,(string *)pathIn);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
      ::_Rb_tree(&local_1b0,
                 (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ZounaClasses>,_std::_Select1st<std::pair<const_unsigned_int,_ZounaClasses>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ZounaClasses>_>_>
                  *)crc);
      iVar3 = (*pPVar5->_vptr_Parser[2])(pPVar5,local_4d0,&local_1b0);
      plVar6 = (long *)CONCAT44(extraout_var_00,iVar3);
      CRC32Lookup::~CRC32Lookup((CRC32Lookup *)&local_1b0);
      std::__cxx11::string::~string(local_4d0);
      if (plVar6 == (long *)0x0) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&local_370,"Couldn\'t parse %s!\n",(allocator *)&newbase);
        formatString<char_const*>(&totalPath,&local_370,(pathIn->_M_dataplus)._M_p);
        std::runtime_error::runtime_error(prVar7,(string *)&totalPath);
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::string((string *)&local_4f0,(string *)baseNamePathOut);
      getFileExtension(&totalPath,&local_4f0);
      std::__cxx11::string::~string((string *)&totalPath);
      std::__cxx11::string::~string((string *)&local_4f0);
      if (totalPath._M_string_length == 0) {
        std::operator+(&totalPath,baseNamePathOut,".");
        std::operator+(&local_510,&totalPath,&fileExt);
        (**(code **)(*plVar6 + 0x18))(plVar6,&local_510);
        std::__cxx11::string::~string((string *)&local_510);
        psVar8 = &totalPath;
      }
      else {
        std::__cxx11::string::string((string *)&local_530,(string *)baseNamePathOut);
        (**(code **)(*plVar6 + 0x18))(plVar6,&local_530);
        psVar8 = &local_530;
      }
    }
    std::__cxx11::string::~string((string *)psVar8);
    (*pPVar5->_vptr_Parser[1])(pPVar5);
    (**(code **)(*plVar6 + 0x10))(plVar6);
  }
LAB_0010612b:
  std::__cxx11::string::~string((string *)&fileExt);
  return;
}

Assistant:

void autoDump(std::string pathIn, std::string baseNamePathOut, CRC32Lookup crc, bool recursive, bool autoConv){
    if(isADirectory(pathIn)){
        struct dirent *entry = nullptr;
        DIR *dir = nullptr;
        dir = opendir(pathIn.c_str());
        while( (entry=readdir(dir))){
            std::string childPath = entry->d_name;
            //delete entry;
            if (childPath=="." || childPath == "..")
                continue;
            std::string totalPath = trailFolder(pathIn)+childPath;
            if(isADirectory(totalPath)&&recursive){
                if(!isADirectory(baseNamePathOut))
                    mkdir(baseNamePathOut.c_str(),S_IRWXU);
                std::string newbase= trailFolder(baseNamePathOut)+childPath;
                if (!isADirectory(newbase))
                    if ( mkdir(newbase.c_str(), 0700) != 0)
                        throw CANT_WRITE(newbase.c_str());
                autoDump(trailFolder(totalPath),trailFolder(newbase),crc,recursive,autoConv);
                continue;
            }
            autoDump(totalPath,getFileBase(baseNamePathOut+childPath),crc,recursive,autoConv);
        }
        closedir(dir);
        return;
    }
    ZounaClasses type = autoDetectFile(pathIn,crc);
    //TODO: avoid having to initialize a parser object every darn time
    Parser *parser = getMatchingParser(type,crc);

    std::string fileExt;
    switch(type){

    case ZounaClasses::Bitmap_Z:
        fileExt="png";
        break;
    case ZounaClasses::Mesh_Z:
        fileExt="obj";
        break;

    case ZounaClasses::Sound_Z:
        fileExt="wav";
        break;
    case ZounaClasses::sdx:{
        ParserResult *result = parser->parseFile(pathIn,crc);
        result->dump(trailFolder(baseNamePathOut));
        delete parser;
        delete result;
        return;
    }

    case ZounaClasses::DPC:
        try{
            ParserResult *result = parser->parseFile(pathIn,crc);
            std::string path = trailFolder(baseNamePathOut);
            result->dump(path);
            if (autoConv)
                autoDump(path,path,crc,recursive,autoConv);
            delete parser;
            delete result;
        }catch(std::runtime_error e){
            std::cout<<e.what();
        }
        return;
    default:
        //How
        return;
    }
    ParserResult *result;
    result = parser->parseFile(pathIn,crc);
    if (result == nullptr)
        throw CANT_PARSE(pathIn.c_str());
    if (getFileExtension(baseNamePathOut).empty())
        result->dump(baseNamePathOut+"."+fileExt);
    else
        result->dump(baseNamePathOut); //TODO: check given file-extension vs expected extension
    delete parser;
    delete result;
}